

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hlslParseHelper.cpp
# Opt level: O0

void __thiscall glslang::HlslParseContext::trackLinkage(HlslParseContext *this,TSymbol *symbol)

{
  int iVar1;
  undefined4 extraout_var;
  long lVar2;
  ulong uVar3;
  undefined4 extraout_var_00;
  mapped_type *ppTVar4;
  key_type local_1c;
  TSymbol *pTStack_18;
  TBuiltInVariable biType;
  TSymbol *symbol_local;
  HlslParseContext *this_local;
  
  pTStack_18 = symbol;
  symbol_local = (TSymbol *)this;
  iVar1 = (*symbol->_vptr_TSymbol[0xc])();
  lVar2 = (**(code **)(*(long *)CONCAT44(extraout_var,iVar1) + 0x58))();
  uVar3 = *(ulong *)(lVar2 + 8) >> 7;
  local_1c = (key_type)uVar3 & 0x1ff;
  if ((uVar3 & 0x1ff) != 0) {
    iVar1 = (**pTStack_18->_vptr_TSymbol)();
    ppTVar4 = std::
              map<glslang::TBuiltInVariable,_glslang::TSymbol_*,_std::less<glslang::TBuiltInVariable>,_glslang::pool_allocator<std::pair<const_glslang::TBuiltInVariable,_glslang::TSymbol_*>_>_>
              ::operator[](&(this->builtInTessLinkageSymbols).
                            super_map<glslang::TBuiltInVariable,_glslang::TSymbol_*,_std::less<glslang::TBuiltInVariable>,_glslang::pool_allocator<std::pair<const_glslang::TBuiltInVariable,_glslang::TSymbol_*>_>_>
                           ,&local_1c);
    *ppTVar4 = (mapped_type)CONCAT44(extraout_var_00,iVar1);
  }
  TParseContextBase::trackLinkage(&this->super_TParseContextBase,pTStack_18);
  return;
}

Assistant:

void HlslParseContext::trackLinkage(TSymbol& symbol)
{
    TBuiltInVariable biType = symbol.getType().getQualifier().builtIn;

    if (biType != EbvNone)
        builtInTessLinkageSymbols[biType] = symbol.clone();

    TParseContextBase::trackLinkage(symbol);
}